

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result wabt::ParseWatModule
                 (WastLexer *lexer,
                 unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *out_module,
                 Errors *errors,WastParseOptions *options)

{
  Result RVar1;
  undefined1 local_e8 [8];
  WastParser parser;
  
  if (out_module != (unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)0x0) {
    WastParser::WastParser((WastParser *)local_e8,lexer,errors,options);
    RVar1 = WastParser::ParseModule((WastParser *)local_e8,out_module);
    CircularArray<wabt::Token,_2UL>::~CircularArray
              ((CircularArray<wabt::Token,_2UL> *)&parser.options_);
    return (Result)RVar1.enum_;
  }
  __assert_fail("out_module != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                ,0x9a0,
                "Result wabt::ParseWatModule(WastLexer *, std::unique_ptr<Module> *, Errors *, WastParseOptions *)"
               );
}

Assistant:

Result ParseWatModule(WastLexer* lexer,
                      std::unique_ptr<Module>* out_module,
                      Errors* errors,
                      WastParseOptions* options) {
  assert(out_module != nullptr);
  WastParser parser(lexer, errors, options);
  return parser.ParseModule(out_module);
}